

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordered_set.h
# Opt level: O2

void __thiscall xla::OrderedSet<int>::Erase(OrderedSet<int> *this,int value)

{
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  mapped_type mVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  iterator __it;
  mapped_type *pmVar5;
  ostream *poVar6;
  key_type_conflict1 local_24;
  
  this_00 = &this->value_to_index_;
  __it = std::
         _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&this_00->_M_h,&local_24);
  if (__it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur != (__node_type *)0x0)
  {
    mVar1 = *(mapped_type *)
             ((long)__it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur + 0xc);
    pmVar5 = std::__detail::
             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,
                          (this->value_sequence_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish + -1);
    *pmVar5 = mVar1;
    piVar3 = (this->value_sequence_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->value_sequence_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar2 = piVar3[*(int *)((long)__it.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                                  _M_cur + 0xc)];
    piVar3[*(int *)((long)__it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur +
                   0xc)] = piVar4[-1];
    piVar4[-1] = iVar2;
    (this->value_sequence_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar4 + -1;
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&this_00->_M_h,
            (const_iterator)__it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur)
    ;
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"Value not found in OrderedSet");
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(0);
}

Assistant:

void Erase(T value) {
    auto it = value_to_index_.find(value);
    if (it == value_to_index_.end()) {
      std::cerr << "Value not found in OrderedSet" << std::endl;
      exit(0);
    }

    auto index = it->second;
    // Since we don't want to move values around in `value_sequence_` we swap
    // the value in the last position and with value to be deleted and then
    // pop_back.
    value_to_index_[value_sequence_.back()] = index;
    std::swap(value_sequence_[it->second], value_sequence_.back());
    value_sequence_.pop_back();
    value_to_index_.erase(it);
  }